

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

size_t aead_do_decrypt(ptls_aead_context_t *_ctx,void *_output,void *input,size_t inlen,uint64_t seq
                      ,void *aad,size_t aadlen)

{
  int iVar1;
  ulong in_RCX;
  uchar *in_RDX;
  long in_RSI;
  long *in_RDI;
  uint64_t in_R8;
  uchar *in_R9;
  int ret;
  int blocklen;
  size_t tag_size;
  size_t off;
  uint8_t iv [16];
  uint8_t *output;
  aead_crypto_context_t *ctx;
  int local_6c;
  ulong local_68;
  long local_60;
  uint8_t local_58 [16];
  long local_48;
  long *local_40;
  uchar *local_38;
  ulong local_28;
  uchar *local_20;
  size_t local_8;
  
  local_60 = 0;
  local_68 = *(ulong *)(*in_RDI + 0x38);
  if (in_RCX < local_68) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_48 = in_RSI;
    local_40 = in_RDI;
    local_38 = in_R9;
    local_28 = in_RCX;
    local_20 = in_RDX;
    ptls_aead__build_iv((ptls_aead_algorithm_t *)*in_RDI,local_58,(uint8_t *)(in_RDI + 9),in_R8);
    iVar1 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)local_40[8],(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                               (uchar *)0x0,local_58);
    if (iVar1 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                    ,0x3b6,
                    "size_t aead_do_decrypt(ptls_aead_context_t *, void *, const void *, size_t, uint64_t, const void *, size_t)"
                   );
    }
    if ((_ret != 0) &&
       (iVar1 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)local_40[8],(uchar *)0x0,&local_6c,local_38,
                                  (int)_ret), iVar1 == 0)) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                    ,0x3b9,
                    "size_t aead_do_decrypt(ptls_aead_context_t *, void *, const void *, size_t, uint64_t, const void *, size_t)"
                   );
    }
    iVar1 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)local_40[8],(uchar *)(local_48 + local_60),&local_6c
                              ,local_20,(int)local_28 - (int)local_68);
    if (iVar1 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                    ,0x3bc,
                    "size_t aead_do_decrypt(ptls_aead_context_t *, void *, const void *, size_t, uint64_t, const void *, size_t)"
                   );
    }
    local_60 = local_6c + local_60;
    iVar1 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)local_40[8],0x11,(int)local_68,
                                local_20 + (local_28 - local_68));
    if (iVar1 == 0) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      iVar1 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)local_40[8],(uchar *)(local_48 + local_60),
                                  &local_6c);
      if (iVar1 == 0) {
        local_8 = 0xffffffffffffffff;
      }
      else {
        local_8 = local_6c + local_60;
      }
    }
  }
  return local_8;
}

Assistant:

static size_t aead_do_decrypt(ptls_aead_context_t *_ctx, void *_output, const void *input, size_t inlen, uint64_t seq,
                              const void *aad, size_t aadlen)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t *output = _output, iv[PTLS_MAX_IV_SIZE];
    size_t off = 0, tag_size = ctx->super.algo->tag_size;
    int blocklen, ret;

    if (inlen < tag_size)
        return SIZE_MAX;

    ptls_aead__build_iv(ctx->super.algo, iv, ctx->static_iv, seq);
    ret = EVP_DecryptInit_ex(ctx->evp_ctx, NULL, NULL, NULL, iv);
    assert(ret);
    if (aadlen != 0) {
        ret = EVP_DecryptUpdate(ctx->evp_ctx, NULL, &blocklen, aad, (int)aadlen);
        assert(ret);
    }
    ret = EVP_DecryptUpdate(ctx->evp_ctx, output + off, &blocklen, input, (int)(inlen - tag_size));
    assert(ret);
    off += blocklen;
    if (!EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_SET_TAG, (int)tag_size, (void *)((uint8_t *)input + inlen - tag_size)))
        return SIZE_MAX;
    if (!EVP_DecryptFinal_ex(ctx->evp_ctx, output + off, &blocklen))
        return SIZE_MAX;
    off += blocklen;

    return off;
}